

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O1

void once_cb_to(ev_loop *loop,ev_timer *w,int revents)

{
  ANPENDING *pAVar1;
  uint uVar2;
  long lVar3;
  
  lVar3 = (long)w[-1].pending;
  if (lVar3 == 0) {
    uVar2 = 0;
  }
  else {
    pAVar1 = loop->pendings[(long)w[-1].priority + 2];
    pAVar1[lVar3 + -1].w = (W)&loop->pending_w;
    w[-1].pending = 0;
    uVar2 = pAVar1[lVar3 + -1].events;
  }
  once_cb(loop,(ev_once *)(w + -1),uVar2 | revents);
  return;
}

Assistant:

int
ev_clear_pending (EV_P_ void *w) EV_THROW
{
  W w_ = (W)w;
  int pending = w_->pending;

  if (expect_true (pending))
    {
      ANPENDING *p = pendings [ABSPRI (w_)] + pending - 1;
      p->w = (W)&pending_w;
      w_->pending = 0;
      return p->events;
    }
  else
    return 0;
}